

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_multicast(compiler_state_t *cstate,int proto)

{
  bpf_abs_offset *abs_offset;
  int iVar1;
  block *pbVar2;
  slist *psVar3;
  block *pbVar4;
  block *pbVar5;
  ulong uVar6;
  u_int offset;
  
  if (1 < (uint)proto) {
    if (proto != 2) {
      if (proto == 0x11) {
        pbVar2 = gen_linktype(cstate,0x86dd);
        psVar3 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,cstate->off_nl + 0x18,0x10);
        pbVar4 = (block *)newchunk(cstate,0x120);
        (pbVar4->s).code = 0x15;
        pbVar4->head = pbVar4;
        pbVar4->stmts = psVar3;
        (pbVar4->s).k = 0xff;
        goto LAB_0010feae;
      }
      goto switchD_0010fdf5_caseD_2;
    }
    pbVar2 = gen_linktype(cstate,0x800);
    psVar3 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,cstate->off_nl + 0x10,0x10);
    pbVar4 = (block *)newchunk(cstate,0x120);
    (pbVar4->s).code = 0x35;
    pbVar4->head = pbVar4;
    pbVar4->stmts = psVar3;
    (pbVar4->s).k = 0xe0;
    goto LAB_0010feae;
  }
  iVar1 = cstate->linktype;
  if (iVar1 < 0x69) {
    switch(iVar1) {
    case 1:
      goto switchD_0010fdf5_caseD_1;
    default:
      goto switchD_0010fdf5_caseD_2;
    case 6:
switchD_0010fdf5_caseD_6:
      offset = 2;
LAB_0010fed4:
      psVar3 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,offset,0x10);
      pbVar4 = (block *)newchunk(cstate,0x120);
      (pbVar4->s).code = 0x45;
      pbVar4->head = pbVar4;
      (pbVar4->s).k = 1;
      pbVar4->stmts = psVar3;
      return pbVar4;
    case 7:
switchD_0010fdf5_caseD_7:
      pbVar4 = gen_bcmp(cstate,OR_LINKHDR,1,1,(u_char *)"");
      return pbVar4;
    case 10:
      offset = 1;
      goto LAB_0010fed4;
    }
  }
  uVar6 = (ulong)(iVar1 - 0x69U);
  if (iVar1 - 0x69U < 0x3b) {
    if ((0x400000000404001U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0x11) goto switchD_0010fdf5_caseD_6;
      if (uVar6 == 0x18) goto switchD_0010fdf5_caseD_7;
      goto LAB_0010fe47;
    }
  }
  else {
LAB_0010fe47:
    if (iVar1 - 0xf0U < 2) goto switchD_0010fdf5_caseD_1;
    if (iVar1 != 0xc0) {
switchD_0010fdf5_caseD_2:
      bpf_error(cstate,
                "link-layer multicast filters supported only on ethernet/FDDI/token ring/ARCNET/802.11/ATM LANE/Fibre Channel"
               );
    }
  }
  abs_offset = &cstate->off_linkhdr;
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,1,0x10);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x45;
  pbVar2->head = pbVar2;
  (pbVar2->s).k = 1;
  pbVar2->stmts = psVar3;
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0x10,0x10);
  pbVar4 = (block *)newchunk(cstate,0x120);
  (pbVar4->s).code = 0x45;
  pbVar4->head = pbVar4;
  (pbVar4->s).k = 1;
  pbVar4->stmts = psVar3;
  gen_and(pbVar2,pbVar4);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,1,0x10);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x45;
  pbVar2->head = pbVar2;
  (pbVar2->s).k = 1;
  pbVar2->stmts = psVar3;
  pbVar2->sense = (uint)(pbVar2->sense == 0);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,4,0x10);
  pbVar5 = (block *)newchunk(cstate,0x120);
  (pbVar5->s).code = 0x45;
  pbVar5->head = pbVar5;
  (pbVar5->s).k = 1;
  pbVar5->stmts = psVar3;
  gen_and(pbVar2,pbVar5);
  gen_or(pbVar5,pbVar4);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x45;
  pbVar2->head = pbVar2;
  (pbVar2->s).k = 8;
  pbVar2->stmts = psVar3;
  gen_and(pbVar2,pbVar4);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x45;
  pbVar2->head = pbVar2;
  (pbVar2->s).k = 8;
  pbVar2->stmts = psVar3;
  pbVar2->sense = (uint)(pbVar2->sense == 0);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,4,0x10);
  pbVar5 = (block *)newchunk(cstate,0x120);
  (pbVar5->s).code = 0x45;
  pbVar5->head = pbVar5;
  (pbVar5->s).k = 1;
  pbVar5->stmts = psVar3;
  gen_and(pbVar2,pbVar5);
  gen_or(pbVar5,pbVar4);
  psVar3 = gen_load_absoffsetrel(cstate,abs_offset,0,0x10);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x45;
  pbVar2->head = pbVar2;
  (pbVar2->s).k = 4;
  pbVar2->stmts = psVar3;
  pbVar2->sense = (uint)(pbVar2->sense == 0);
LAB_0010feae:
  gen_and(pbVar2,pbVar4);
  return pbVar4;
switchD_0010fdf5_caseD_1:
  pbVar2 = gen_prevlinkhdr_check(cstate);
  psVar3 = gen_load_absoffsetrel(cstate,&cstate->off_linkhdr,0,0x10);
  pbVar4 = (block *)newchunk(cstate,0x120);
  (pbVar4->s).code = 0x45;
  pbVar4->head = pbVar4;
  (pbVar4->s).k = 1;
  pbVar4->stmts = psVar3;
  if (pbVar2 == (block *)0x0) {
    return pbVar4;
  }
  goto LAB_0010feae;
}

Assistant:

struct block *
gen_multicast(compiler_state_t *cstate, int proto)
{
	register struct block *b0, *b1, *b2;
	register struct slist *s;

	switch (proto) {

	case Q_DEFAULT:
	case Q_LINK:
		switch (cstate->linktype) {
		case DLT_ARCNET:
		case DLT_ARCNET_LINUX:
			/* all ARCnet multicasts use the same address */
			return gen_ahostop(cstate, abroadcast, Q_DST);
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			b1 = gen_prevlinkhdr_check(cstate);
			/* ether[0] & 1 != 0 */
			b0 = gen_mac_multicast(cstate, 0);
			if (b1 != NULL)
				gen_and(b1, b0);
			return b0;
		case DLT_FDDI:
			/*
			 * XXX TEST THIS: MIGHT NOT PORT PROPERLY XXX
			 *
			 * XXX - was that referring to bit-order issues?
			 */
			/* fddi[1] & 1 != 0 */
			return gen_mac_multicast(cstate, 1);
		case DLT_IEEE802:
			/* tr[2] & 1 != 0 */
			return gen_mac_multicast(cstate, 2);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			/*
			 * Oh, yuk.
			 *
			 *	For control frames, there is no DA.
			 *
			 *	For management frames, DA is at an
			 *	offset of 4 from the beginning of
			 *	the packet.
			 *
			 *	For data frames, DA is at an offset
			 *	of 4 from the beginning of the packet
			 *	if To DS is clear and at an offset of
			 *	16 from the beginning of the packet
			 *	if To DS is set.
			 */

			/*
			 * Generate the tests to be done for data frames.
			 *
			 * First, check for To DS set, i.e. "link[1] & 0x01".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x01;	/* To DS */
			b1->stmts = s;

			/*
			 * If To DS is set, the DA is at 16.
			 */
			b0 = gen_mac_multicast(cstate, 16);
			gen_and(b1, b0);

			/*
			 * Now, check for To DS not set, i.e. check
			 * "!(link[1] & 0x01)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 1, BPF_B);
			b2 = new_block(cstate, JMP(BPF_JSET));
			b2->s.k = 0x01;	/* To DS */
			b2->stmts = s;
			gen_not(b2);

			/*
			 * If To DS is not set, the DA is at 4.
			 */
			b1 = gen_mac_multicast(cstate, 4);
			gen_and(b2, b1);

			/*
			 * Now OR together the last two checks.  That gives
			 * the complete set of checks for data frames.
			 */
			gen_or(b1, b0);

			/*
			 * Now check for a data frame.
			 * I.e, check "link[0] & 0x08".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x08;
			b1->stmts = s;

			/*
			 * AND that with the checks done for data frames.
			 */
			gen_and(b1, b0);

			/*
			 * If the high-order bit of the type value is 0, this
			 * is a management frame.
			 * I.e, check "!(link[0] & 0x08)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b2 = new_block(cstate, JMP(BPF_JSET));
			b2->s.k = 0x08;
			b2->stmts = s;
			gen_not(b2);

			/*
			 * For management frames, the DA is at 4.
			 */
			b1 = gen_mac_multicast(cstate, 4);
			gen_and(b2, b1);

			/*
			 * OR that with the checks done for data frames.
			 * That gives the checks done for management and
			 * data frames.
			 */
			gen_or(b1, b0);

			/*
			 * If the low-order bit of the type value is 1,
			 * this is either a control frame or a frame
			 * with a reserved type, and thus not a
			 * frame with an SA.
			 *
			 * I.e., check "!(link[0] & 0x04)".
			 */
			s = gen_load_a(cstate, OR_LINKHDR, 0, BPF_B);
			b1 = new_block(cstate, JMP(BPF_JSET));
			b1->s.k = 0x04;
			b1->stmts = s;
			gen_not(b1);

			/*
			 * AND that with the checks for data and management
			 * frames.
			 */
			gen_and(b1, b0);
			return b0;
		case DLT_IP_OVER_FC:
			b0 = gen_mac_multicast(cstate, 2);
			return b0;
		default:
			break;
		}
		/* Link not known to support multicasts */
		break;

	case Q_IP:
		b0 = gen_linktype(cstate, ETHERTYPE_IP);
		b1 = gen_cmp_ge(cstate, OR_LINKPL, 16, BPF_B, (bpf_int32)224);
		gen_and(b0, b1);
		return b1;

	case Q_IPV6:
		b0 = gen_linktype(cstate, ETHERTYPE_IPV6);
		b1 = gen_cmp(cstate, OR_LINKPL, 24, BPF_B, (bpf_int32)255);
		gen_and(b0, b1);
		return b1;
	}
	bpf_error(cstate, "link-layer multicast filters supported only on ethernet/FDDI/token ring/ARCNET/802.11/ATM LANE/Fibre Channel");
	/* NOTREACHED */
	return NULL;
}